

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O2

void __thiscall
SparseArray_Iterator_Test<pstore::uint128>::SparseArray_Iterator_Test
          (SparseArray_Iterator_Test<pstore::uint128> *this)

{
  anon_unknown.dwarf_c17be::SparseArray<pstore::uint128>::SparseArray
            (&this->super_SparseArray<pstore::uint128>);
  (this->super_SparseArray<pstore::uint128>).super_Test._vptr_Test =
       (_func_int **)&PTR__Test_002273b8;
  return;
}

Assistant:

TYPED_TEST (SparseArray, Iterator) {
    auto arr =
        sparse_array<char const *, TypeParam>::make_unique ({{0, "zero"}, {2, "two"}, {4, "four"}});

    std::vector<std::string> actual;
    std::copy (std::begin (*arr), std::end (*arr), std::back_inserter (actual));

    std::vector<std::string> const expected{"zero", "two", "four"};
    EXPECT_THAT (actual, ::testing::ContainerEq (expected));
}